

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decode.c
# Opt level: O0

void create_se_table(int *table)

{
  int iVar1;
  int local_20;
  int j;
  int ms;
  int i;
  int k;
  int *table_local;
  
  ms = 0;
  for (j = 0; iVar1 = ms, j < 0xd; j = j + 1) {
    for (local_20 = 0; local_20 <= j; local_20 = local_20 + 1) {
      table[ms << 1] = j;
      table[ms * 2 + 1] = iVar1;
      ms = ms + 1;
    }
  }
  return;
}

Assistant:

static void create_se_table(int *table)
{
    int k = 0;
    for (int i = 0; i < 13; i++) {
        int ms = k;
        for (int j = 0; j <= i; j++) {
            table[2 * k] = i;
            table[2 * k + 1] = ms;
            k++;
        }
    }
}